

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::RgbaInputFile::readPixels(RgbaInputFile *this,int scanLine1,int scanLine2)

{
  int iVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  char *pcVar3;
  RgbaChannels RVar4;
  FrameBuffer *this_00;
  Slice *pSVar5;
  Header *this_01;
  Box2i *pBVar6;
  long lVar7;
  long lVar8;
  int x;
  long lVar9;
  long lVar10;
  lock_guard<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  __mutex = (pthread_mutex_t *)this->_fromYca;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    FromYca::readPixels(this->_fromYca,scanLine1,scanLine2);
    pthread_mutex_unlock(__mutex);
    return;
  }
  InputPart::readPixels(this->_inputPart,scanLine1,scanLine2);
  RVar4 = channels(this);
  if ((RVar4 & WRITE_Y) != 0) {
    this_00 = InputPart::frameBuffer(this->_inputPart);
    std::operator+(&bStack_48,&this->_channelNamePrefix,"Y");
    pSVar5 = FrameBuffer::findSlice(this_00,&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    this_01 = InputPart::header(this->_inputPart);
    pBVar6 = Header::dataWindow(this_01);
    iVar1 = (pBVar6->min).x;
    iVar2 = (pBVar6->max).x;
    pcVar3 = pSVar5->base;
    for (lVar7 = (long)scanLine1; lVar7 <= scanLine2; lVar7 = lVar7 + 1) {
      lVar8 = pSVar5->yStride * lVar7;
      for (lVar9 = (long)iVar1; lVar9 <= iVar2; lVar9 = lVar9 + 1) {
        lVar10 = pSVar5->xStride * lVar9;
        *(undefined2 *)(pcVar3 + lVar10 + lVar8 + 2) = *(undefined2 *)(pcVar3 + lVar10 + lVar8);
        *(undefined2 *)(pcVar3 + lVar10 + lVar8 + 4) = *(undefined2 *)(pcVar3 + lVar10 + lVar8);
      }
    }
  }
  return;
}

Assistant:

void
RgbaInputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_fromYca)
    {
        std::lock_guard<std::mutex> lock (*_fromYca);
        _fromYca->readPixels (scanLine1, scanLine2);
    }
    else
    {
        _inputPart->readPixels (scanLine1, scanLine2);

        if (channels () & WRITE_Y)
        {
            //
            // Luma channel has been written into red channel
            // Duplicate into green and blue channel to create gray image
            //
            const Slice* s =
                _inputPart->frameBuffer ().findSlice (_channelNamePrefix + "Y");
            Box2i    dataWindow = _inputPart->header ().dataWindow ();
            intptr_t base       = reinterpret_cast<intptr_t> (s->base);

            for (int scanLine = scanLine1; scanLine <= scanLine2; scanLine++)
            {
                intptr_t rowBase = base + scanLine * s->yStride;
                for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
                {
                    Rgba* pixel =
                        reinterpret_cast<Rgba*> (rowBase + x * s->xStride);
                    pixel->g = pixel->r;
                    pixel->b = pixel->r;
                }
            }
        }
    }
}